

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmCpBcc<(moira::Instr)147,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Int i;
  u32 uVar2;
  Ims<2> im;
  StrWriter *this_00;
  
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    dasmIllegal<(moira::Instr)147,(moira::Mode)12,2>(this,str,addr,op);
    return;
  }
  uVar1 = *addr;
  i.raw = dasmIncRead<2>(this,addr);
  uVar2 = dasmIncRead<2>(this,addr);
  im.raw = dasmIncRead<2>(this,addr);
  StrWriter::operator<<(str,op >> 9 & 7);
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Cpcc)(op & 0x3f));
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  StrWriter::operator<<(this_00,im);
  StrWriter::operator<<(str,"; ");
  StrWriter::operator<<(str,(UInt)(uVar1 + (int)(short)uVar2 + 2));
  StrWriter::operator<<(str," (extension = ");
  StrWriter::operator<<(str,i);
  StrWriter::operator<<(str,") (2-3)");
  return;
}

Assistant:

void
Moira::dasmCpBcc(StrWriter &str, u32 &addr, u16 op) const
{
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    auto id   = ( ____xxx_________(op) );
    auto cnd  = ( __________xxxxxx(op) );
    auto pc   = addr + 2;
    auto ext1 = dasmIncRead<Word>(addr);
    auto disp = dasmIncRead<S>(addr);
    auto ext2 = dasmIncRead<Word>(addr);

    pc += SEXT<S>(disp);

    str << id << Ins<I>{} << Cpcc{cnd} << str.tab << Ims<Word>(ext2);
    str << "; " << UInt(pc) << " (extension = " << Int(ext1) << ") (2-3)";
}